

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v10::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  compute_mul_parity_result cVar9;
  byte bVar10;
  int iVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  uint128_fallback uVar22;
  decimal_fp<double> dVar23;
  cache_entry_type cache;
  uint128_fallback local_40;
  
  uVar17 = (ulong)x & 0xfffffffffffff;
  uVar18 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar18 == 0) {
    uVar18 = 0xfffffbce;
    if (uVar17 == 0) {
      iVar11 = 0;
      uVar14 = 0;
      goto LAB_00134318;
    }
LAB_00133f91:
    iVar11 = (int)(uVar18 * 0x4d105) >> 0x14;
    local_40 = cache_accessor<double>::get_cached_power(2 - iVar11);
    iVar13 = ((2 - iVar11) * 0x1a934f >> 0x13) + uVar18;
    uVar14 = uVar17 * 2 + 1 << ((byte)iVar13 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar14;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_40.hi_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar14;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_40.lo_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB168(auVar2 * auVar7,8);
    auVar8 = auVar1 * auVar6 + auVar8;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar8._8_8_;
    uVar14 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    uVar18 = auVar8._8_4_ + (int)uVar14 * -1000;
    uVar19 = (uint)(local_40.hi_ >> (~(byte)iVar13 & 0x3f));
    if (uVar18 < uVar19) {
      if ((uVar18 != 0) || ((auVar8._0_8_ != 0 || ((uVar17 & 1) == 0)))) {
LAB_00134079:
        if (uVar14 == 0) {
LAB_0013432c:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format-inl.h"
                      ,0x487,"");
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar14;
        if (SUB168(auVar4 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
            (auVar4 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
            (undefined1  [16])0x0) {
          uVar14 = uVar14 / 100000000;
          if (uVar14 == 0) {
LAB_0013435c:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format-inl.h"
                        ,0x472,"");
          }
          iVar13 = 6;
          do {
            uVar18 = (uint)uVar14;
            uVar19 = uVar18 * 0x40000000 | uVar18 * -0x3d70a3d7 >> 2;
            uVar14 = (ulong)uVar19;
            iVar13 = iVar13 + 2;
          } while (uVar19 < 0x28f5c29);
          goto LAB_001342a2;
        }
        iVar13 = -2;
        do {
          uVar17 = uVar14;
          uVar14 = uVar17 * -0x70a3d70a3d70a3d7 >> 2 | uVar17 << 0x3e;
          iVar13 = iVar13 + 2;
        } while (uVar14 < 0x28f5c28f5c28f5d);
        uVar14 = uVar17 * -0x3333333333333333 >> 1 | uVar17 << 0x3f;
        bVar21 = uVar14 < 0x199999999999999a;
        if (!bVar21) {
          uVar14 = uVar17;
        }
        goto LAB_00134311;
      }
      uVar14 = uVar14 - 1;
      uVar18 = 1000;
    }
    else if ((uVar18 <= uVar19) &&
            (cVar9 = cache_accessor<double>::compute_mul_parity(uVar17 * 2 - 1,&local_40,iVar13),
            (~(uint)uVar17 & (uint)((ushort)cVar9 >> 8) & 1) != 0 || ((ushort)cVar9 & 1) != 0))
    goto LAB_00134079;
    uVar18 = uVar18 - (uVar19 >> 1);
    uVar19 = uVar18 + 0x32;
    if (1000 < uVar19) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format-inl.h"
                  ,0xdd,"n is too large");
    }
    uVar19 = uVar19 * 0x290;
    uVar20 = uVar19 >> 0x10;
    uVar14 = (ulong)uVar20 + uVar14 * 10;
    if ((uVar19 & 0xffff) < 0x290) {
      cVar9 = cache_accessor<double>::compute_mul_parity(uVar17 * 2,&local_40,iVar13);
      if ((uVar18 & 1) == ((ushort)cVar9 & 1)) {
        uVar14 = uVar14 + (long)(int)-(uVar20 & (ushort)cVar9 >> 8 & 1);
      }
      else {
        uVar14 = uVar14 - 1;
      }
    }
  }
  else {
    uVar18 = uVar18 - 0x433;
    if (uVar17 != 0) {
      uVar17 = uVar17 + 0x10000000000000;
      goto LAB_00133f91;
    }
    iVar11 = (int)(uVar18 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar12 = (char)(iVar11 * -0x1a934f >> 0x13) + (char)uVar18;
    uVar22 = cache_accessor<double>::get_cached_power(-iVar11);
    uVar14 = uVar22.hi_;
    bVar10 = 0xb - cVar12;
    uVar15 = (uVar14 >> 0x35) + uVar14 >> (bVar10 & 0x3f);
    uVar16 = (ulong)((uVar18 & 0xfffffffe) != 2) + (uVar14 - (uVar14 >> 0x36) >> (bVar10 & 0x3f));
    uVar17 = uVar15 / 10;
    if (uVar17 * 10 < uVar16) {
      uVar14 = (uVar14 >> (10U - cVar12 & 0x3f)) + 1 >> 1;
      if (uVar18 == 0xffffffb3) {
        uVar14 = uVar14 & 0xfffffffffffffffe;
      }
      else {
        uVar14 = uVar14 + (uVar14 < uVar16);
      }
      goto LAB_00134318;
    }
    if (uVar15 < 10) goto LAB_0013432c;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar17;
    if (SUB168(auVar5 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar5 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar17 = uVar17 / 100000000;
      if ((int)uVar17 == 0) goto LAB_0013435c;
      iVar13 = 6;
      do {
        uVar18 = (uint)uVar17;
        uVar19 = uVar18 * 0x40000000 | uVar18 * -0x3d70a3d7 >> 2;
        uVar17 = (ulong)uVar19;
        iVar13 = iVar13 + 2;
      } while (uVar19 < 0x28f5c29);
LAB_001342a2:
      uVar19 = uVar18 * -0x33333333 >> 1 | (uint)((uVar18 * -0x33333333 & 1) != 0) << 0x1f;
      bVar21 = uVar19 < 0x1999999a;
      if (!bVar21) {
        uVar19 = uVar18;
      }
      uVar14 = (ulong)uVar19;
    }
    else {
      iVar13 = -2;
      do {
        uVar15 = uVar17;
        uVar17 = uVar15 * -0x70a3d70a3d70a3d7 >> 2 | uVar15 << 0x3e;
        iVar13 = iVar13 + 2;
      } while (uVar17 < 0x28f5c28f5c28f5d);
      uVar14 = uVar15 * -0x3333333333333333 >> 1 | uVar15 << 0x3f;
      bVar21 = uVar14 < 0x199999999999999a;
      if (!bVar21) {
        uVar14 = uVar15;
      }
    }
LAB_00134311:
    iVar11 = iVar11 + 1 + iVar13 + (uint)bVar21;
  }
LAB_00134318:
  dVar23.exponent = iVar11;
  dVar23.significand = uVar14;
  dVar23._12_4_ = 0;
  return dVar23;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}